

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniscript.h
# Opt level: O2

void __thiscall
miniscript::internal::InputStack::InputStack
          (InputStack *this,vector<unsigned_char,_std::allocator<unsigned_char>_> in)

{
  long lVar1;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_RSI;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this->available = YES;
  this->has_sig = false;
  this->malleable = false;
  this->non_canon = false;
  this->size = (size_t)((in_RSI->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                        _M_impl.super__Vector_impl_data._M_finish +
                       (1 - (long)(in_RSI->
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)
                                  ._M_impl.super__Vector_impl_data._M_start));
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    Vector<std::vector<unsigned_char,std::allocator<unsigned_char>>>(&this->stack,in_RSI);
    return;
  }
  __stack_chk_fail();
}

Assistant:

InputStack(std::vector<unsigned char> in) : size(in.size() + 1), stack(Vector(std::move(in))) {}